

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLenum eglu::parseClientAPI(string *api)

{
  bool bVar1;
  InternalError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *api_local;
  
  local_18 = api;
  bVar1 = std::operator==(api,"OpenGL");
  if (bVar1) {
    api_local._4_4_ = 0x30a2;
  }
  else {
    bVar1 = std::operator==(local_18,"OpenGL_ES");
    if (bVar1) {
      api_local._4_4_ = 0x30a0;
    }
    else {
      bVar1 = std::operator==(local_18,"OpenVG");
      if (!bVar1) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        std::operator+(&local_58,"Unknown EGL client API \'",local_18);
        std::operator+(&local_38,&local_58,"\'");
        tcu::InternalError::InternalError(this,&local_38);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      api_local._4_4_ = 0x30a1;
    }
  }
  return api_local._4_4_;
}

Assistant:

EGLenum parseClientAPI (const std::string& api)
{
	if (api == "OpenGL")
		return EGL_OPENGL_API;
	else if (api == "OpenGL_ES")
		return EGL_OPENGL_ES_API;
	else if (api == "OpenVG")
		return EGL_OPENVG_API;
	else
		throw tcu::InternalError("Unknown EGL client API '" + api + "'");
}